

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber checkSameContent(TA_Real *buffer1,TA_Real *buffer2)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long in_RSI;
  long in_RDI;
  uint i;
  TA_Real *theBuffer2;
  TA_Real *theBuffer1;
  uint local_2c;
  
  lVar2 = in_RDI + -800;
  lVar3 = in_RSI + -800;
  local_2c = 0;
  while( true ) {
    if (0x1df < local_2c) {
      return TA_TEST_PASS;
    }
    dVar1 = *(double *)(lVar2 + (ulong)local_2c * 8);
    if ((((dVar1 != 8.1489031e-158) || (NAN(dVar1))) &&
        ((dVar1 = *(double *)(lVar2 + (ulong)local_2c * 8), dVar1 != 9.1349043e-200 || (NAN(dVar1)))
        )) && ((*(double *)(lVar2 + (ulong)local_2c * 8) <=
                *(double *)(lVar3 + (ulong)local_2c * 8) - 1e-06 ||
               (*(double *)(lVar3 + (ulong)local_2c * 8) + 1e-06 <=
                *(double *)(lVar2 + (ulong)local_2c * 8))))) break;
    local_2c = local_2c + 1;
  }
  printf("Fail: Large difference found between two value expected identical (%f,%f,%d)\n",
         *(undefined8 *)(lVar2 + (ulong)local_2c * 8),*(undefined8 *)(lVar3 + (ulong)local_2c * 8),
         (ulong)local_2c);
  return TA_TEST_TFRR_CHECK_SAME_CONTENT;
}

Assistant:

ErrorNumber checkSameContent( TA_Real *buffer1,
                              TA_Real *buffer2 )
{
   const TA_Real *theBuffer1;
   const TA_Real *theBuffer2;

   unsigned int i;

   theBuffer1 = buffer1 - TA_BUF_PREFIX;
   theBuffer2 = buffer2 - TA_BUF_PREFIX;

   for( i=0; i < TA_BUF_SIZE; i++ )
   {
        /* TODO Add back nan/inf checking
          (!trio_isnan(theBuffer1[i])) &&
          (!trio_isinf(theBuffer1[i])) &&
         */

      if( (theBuffer1[i] != RESV_PATTERN_SUFFIX) &&
          (theBuffer1[i] != RESV_PATTERN_PREFIX) )
      {

         if(!TA_REAL_EQ( theBuffer1[i], theBuffer2[i], 0.000001))
         {
            printf( "Fail: Large difference found between two value expected identical (%f,%f,%d)\n",
                     theBuffer1[i], theBuffer2[i], i );
            return TA_TEST_TFRR_CHECK_SAME_CONTENT;
         }
      }
   }

   return TA_TEST_PASS;
}